

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmListFileBacktrace *this_00;
  bool bVar1;
  char *pcVar2;
  cmMessenger *messenger;
  iterator iVar3;
  long lVar4;
  pointer pcVar5;
  pointer ppcVar6;
  string name;
  allocator local_129;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_100;
  cmListFile listFile;
  allocator local_c8 [32];
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  pcVar2 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&currentStart,pcVar2,(allocator *)&scope);
  std::__cxx11::string::append((char *)&currentStart);
  this_00 = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&subdirs,this_00,&currentStart);
  cmListFileBacktrace::operator=(this_00,(cmListFileBacktrace *)&subdirs);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&subdirs);
  BuildsystemFileScope::BuildsystemFileScope(&scope,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  pcVar2 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&filesDir,pcVar2,(allocator *)&name);
  std::__cxx11::string::append((char *)&filesDir);
  cmsys::SystemTools::MakeDirectory(filesDir._M_dataplus._M_p);
  bVar1 = cmsys::SystemTools::FileExists(currentStart._M_dataplus._M_p,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                  ,0x57a,"void cmMakefile::Configure()");
  }
  std::__cxx11::string::string((string *)&subdirs,"CMAKE_PARENT_LIST_FILE",(allocator *)&name);
  AddDefinition(this,(string *)&subdirs,currentStart._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&subdirs);
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile(&listFile,currentStart._M_dataplus._M_p,messenger,this_00);
  if (!bVar1) goto LAB_003bbb27;
  bVar1 = IsRootMakefile(this);
  if (bVar1) {
    lVar4 = -(long)listFile.Functions.
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    pcVar5 = listFile.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pcVar5 == listFile.Functions.
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        lVar4 = (long)&((listFile.Functions.
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_cmCommandContext).Name.
                       _M_dataplus._M_p + lVar4;
        if (0x77e < (ulong)-lVar4 && lVar4 != -0x77f) goto LAB_003bb995;
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)subdirs.
                              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        std::__cxx11::string::string((string *)&name,"project",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"set",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"if",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"endif",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"else",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"elseif",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"add_executable",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"add_library",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"target_link_libraries",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"option",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string((string *)&name,"message",local_c8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&name);
        std::__cxx11::string::~string((string *)&name);
        pcVar5 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        goto LAB_003bb957;
      }
      cmsys::SystemTools::LowerCase((string *)&subdirs,(string *)pcVar5);
      bVar1 = std::operator==((string *)&subdirs,"cmake_minimum_required");
      std::__cxx11::string::~string((string *)&subdirs);
      pcVar5 = pcVar5 + 1;
      lVar4 = lVar4 + -0x40;
    } while (!bVar1);
    goto LAB_003bb9b7;
  }
  goto LAB_003bbaad;
  while( true ) {
    cmsys::SystemTools::LowerCase(&name,(string *)pcVar5);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&subdirs,&name);
    std::__cxx11::string::~string((string *)&name);
    pcVar5 = pcVar5 + 1;
    if (iVar3._M_node ==
        (_Base_ptr)
        &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
         super__Vector_impl_data._M_finish) break;
LAB_003bb957:
    if (pcVar5 == listFile.Functions.
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&subdirs);
      goto LAB_003bb9b7;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subdirs);
LAB_003bb995:
  this->CheckCMP0000 = true;
  cmPolicies::ApplyPolicyVersion(this,"2.4");
LAB_003bb9b7:
  pcVar5 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pcVar5 == listFile.Functions.
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::assign((char *)&subdirs);
      std::__cxx11::string::string((string *)local_c8,"Project",&local_129);
      std::__cxx11::string::string((string *)&name,(string *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                (&vStack_100,(value_type *)&name);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&listFile.Functions,
                 (const_iterator)
                 listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)&subdirs);
      std::__cxx11::string::~string((string *)&name);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&subdirs);
      break;
    }
    cmsys::SystemTools::LowerCase((string *)&subdirs,(string *)pcVar5);
    bVar1 = std::operator==((string *)&subdirs,"project");
    std::__cxx11::string::~string((string *)&subdirs);
    pcVar5 = pcVar5 + 1;
  } while (!bVar1);
LAB_003bbaad:
  ReadListFile(this,&listFile,&currentStart);
  bVar1 = cmSystemTools::GetFatalErrorOccured();
  if (bVar1) {
    scope.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            (&subdirs,&this->UnConfiguredDirectories);
  for (ppcVar6 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar6 !=
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
    cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar6)->StateSnapshot);
    ConfigureSubDirectory(this,*ppcVar6);
  }
  AddCMakeDependFilesFromUser(this);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_003bbb27:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&listFile.Functions)
  ;
  std::__cxx11::string::~string((string *)&filesDir);
  BuildsystemFileScope::~BuildsystemFileScope(&scope);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (std::vector<cmListFileFunction>::iterator i =
               listFile.Functions.begin();
             i != listFile.Functions.end(); ++i) {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4");
      }
    }
    bool hasProject = false;
    // search for a project command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}